

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O3

void jsonip::grammar::double_::
     process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state,
               pair<const_char_*,_long> *mp)

{
  pointer *pppVar1;
  semantic_state *this;
  pointer ppVar2;
  helper *phVar3;
  uint uVar4;
  size_type *psVar5;
  size_type *psVar6;
  long lVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  double dVar11;
  double dVar12;
  size_type *local_40;
  string s;
  
  local_40 = &s._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,mp->first,mp->first + mp->second);
  bVar8 = (byte)*local_40;
  if ((bVar8 == 0x2d) || (bVar9 = true, psVar5 = local_40, bVar8 == 0x2b)) {
    bVar9 = bVar8 != 0x2d;
    psVar5 = (size_type *)((long)local_40 + 1);
    s._M_dataplus._M_p._0_4_ = (uint)s._M_dataplus._M_p - 1;
  }
  dVar12 = 0.0;
  if (0 < (int)(uint)s._M_dataplus._M_p) {
    do {
      bVar8 = (byte)*psVar5;
      if ((byte)(bVar8 - 0x30) < 10) {
        dVar12 = dVar12 * 10.0 + (double)(int)(bVar8 - 0x30);
      }
      psVar6 = psVar5;
      uVar4 = (uint)s._M_dataplus._M_p;
      if (bVar8 == 0x2e) {
        if ((uint)s._M_dataplus._M_p < 2) break;
        uVar4 = (uint)s._M_dataplus._M_p + 1;
        dVar11 = 10.0;
        while( true ) {
          psVar5 = (size_type *)((long)psVar5 + 1);
          bVar8 = *(byte *)psVar5;
          if (9 < (byte)(bVar8 - 0x30)) break;
          dVar12 = dVar12 + (double)(int)(bVar8 - 0x30) / dVar11;
          dVar11 = dVar11 * 10.0;
          uVar4 = uVar4 - 1;
          if (uVar4 < 3) goto LAB_00115f55;
        }
        psVar6 = psVar5;
        uVar4 = uVar4 - 2;
      }
      psVar5 = (size_type *)((long)psVar6 + 1);
      s._M_dataplus._M_p._0_4_ = uVar4 - 1;
      if ((bVar8 & 0xdf) == 0x45) {
        bVar8 = *(byte *)psVar5;
        if ((bVar8 == 0x2d) || (bVar10 = true, bVar8 == 0x2b)) {
          bVar10 = bVar8 != 0x2d;
          s._M_dataplus._M_p._0_4_ = uVar4 - 2;
          bVar8 = *(byte *)((long)psVar6 + 2);
          psVar5 = (size_type *)((long)psVar6 + 2);
        }
        if ((int)(uint)s._M_dataplus._M_p < 1) {
          lVar7 = 0;
        }
        else {
          uVar4 = (uint)s._M_dataplus._M_p + 1;
          lVar7 = 0;
          do {
            psVar5 = (size_type *)((long)psVar5 + 1);
            lVar7 = (long)(char)bVar8 + lVar7 * 10 + -0x30;
            bVar8 = *(byte *)psVar5;
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
        }
        if (bVar10) {
          dVar12 = dVar12 * (double)(&parser::parse_double(char_const*,int)::pow_table)[lVar7];
        }
        else {
          dVar12 = dVar12 / (double)(&parser::parse_double(char_const*,int)::pow_table)[lVar7];
        }
        break;
      }
    } while (1 < (int)uVar4);
  }
LAB_00115f55:
  this = state->ss_;
  semantic_state::pre(this);
  if (!bVar9) {
    dVar12 = -dVar12;
  }
  ppVar2 = (this->state).
           super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  phVar3 = ppVar2[-1].second;
  (**(code **)(*(long *)phVar3 + 0x10))(dVar12,phVar3,ppVar2 + -1);
  pppVar1 = &(this->state).
             super__Vector_base<std::pair<jsonip::holder,_const_jsonip::helper_*>,_std::allocator<std::pair<jsonip::holder,_const_jsonip::helper_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  if (local_40 != &s._M_string_length) {
    operator_delete(local_40,s._M_string_length + 1);
  }
  return;
}

Assistant:

static inline void process_match (S& state, match_pair const& mp)
        {
            const std::string s = state.to_string(mp.first, mp.second);
            const double d = parse_double (s.data(), s.size());
            state.semantic_state().new_double(d);
        }